

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::LoadCache(cmake *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  allocator<char> local_51;
  string cacheFile;
  string local_30;
  
  psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
  bVar1 = LoadCache(this,psVar3);
  if (!bVar1) {
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&cacheFile,(string *)psVar3);
    std::__cxx11::string::append((char *)&cacheFile);
    bVar1 = cmsys::SystemTools::FileExists(&cacheFile);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "There is a CMakeCache.txt file for the current binary tree but cmake does not have permission to read it. Please check the permissions of the directory you are trying to run CMake on."
                 ,&local_51);
      cmSystemTools::Error(&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&cacheFile);
      return -1;
    }
    std::__cxx11::string::~string((string *)&cacheFile);
  }
  iVar2 = AddCMakePaths(this);
  return iVar2 * 3 + -3;
}

Assistant:

int cmake::LoadCache()
{
  // could we not read the cache
  if (!this->LoadCache(this->GetHomeOutputDirectory())) {
    // if it does exist, but isn't readable then warn the user
    std::string cacheFile = this->GetHomeOutputDirectory();
    cacheFile += "/CMakeCache.txt";
    if (cmSystemTools::FileExists(cacheFile)) {
      cmSystemTools::Error(
        "There is a CMakeCache.txt file for the current binary tree but "
        "cmake does not have permission to read it. Please check the "
        "permissions of the directory you are trying to run CMake on.");
      return -1;
    }
  }

  // setup CMAKE_ROOT and CMAKE_COMMAND
  if (!this->AddCMakePaths()) {
    return -3;
  }
  return 0;
}